

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  Storage SVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  CompatibilityTestType CVar6;
  int extraout_EAX;
  reference pvVar7;
  DrawTest *this_00;
  RenderContext *renderCtx;
  char *name;
  char *desc;
  string local_440;
  string local_420;
  _Self local_400;
  _Self local_3f8;
  int local_3ec;
  uint local_3e8;
  int attrNdx_1;
  deUint32 hash;
  OutputType local_3dc;
  AttributeSpec attribSpec;
  int iStack_3b0;
  bool valid;
  int attrNdx;
  undefined1 local_3a8 [8];
  DrawTestSpec spec;
  int drawCommandSize;
  int attributeCount;
  undefined1 local_33c [8];
  Random random;
  int ndx;
  size_t insertedCount;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  UniformWeightArray<9> usageWeights;
  Usage usages [9];
  undefined1 local_298 [8];
  UniformWeightArray<12> outputTypeWeights;
  OutputType outputTypes [12];
  UniformWeightArray<11> inputTypeWeights;
  InputType inputTypes [11];
  UniformWeightArray<3> indexTypeWeights;
  IndexType indexTypes [3];
  UniformWeightArray<2> drawMethodWeights;
  DrawMethod drawMethods [2];
  UniformWeightArray<7> primitiveWeights;
  Primitive primitives [7];
  float baseVertexWeigths [5];
  int local_158 [2];
  int baseVertices [5];
  float indirectOffsetWeigths [3];
  int indirectOffsets [3];
  float instanceDivisorWeights [4];
  int instanceDivisors [4];
  float strideWeights [4];
  int strides [4];
  float offsetWeights [4];
  int offsets [4];
  float indexWeights [4];
  int indexMaxs [4];
  int indexMins [4];
  float instanceWeights [4];
  int instanceCounts [4];
  float firstWeights [3];
  int firsts [3];
  float indexOffsetWeights [3];
  int indexOffsets [3];
  float primitiveCountWeights [3];
  int primitiveCounts [3];
  float attribWeights [3];
  int attribCounts [3];
  int numAttempts;
  RandomGroup *this_local;
  
  attribCounts[1] = 100;
  attribWeights[1] = 1.4013e-45;
  attribWeights[2] = 2.8026e-45;
  attribCounts[0] = 5;
  primitiveCounts[1] = 0x41f00000;
  primitiveCounts[2] = 0x41200000;
  attribWeights[0] = 1.0;
  primitiveCountWeights[1] = 1.4013e-45;
  primitiveCountWeights[2] = 7.00649e-45;
  primitiveCounts[0] = 0x40;
  indexOffsets[1] = 0x41a00000;
  indexOffsets[2] = 0x41200000;
  primitiveCountWeights[0] = 1.0;
  indexOffsetWeights[1] = 0.0;
  indexOffsetWeights[2] = 9.80909e-45;
  indexOffsets[0] = 0xd;
  firsts[1] = 0x41a00000;
  firsts[2] = 0x41a00000;
  indexOffsetWeights[0] = 1.0;
  firstWeights[1] = 0.0;
  firstWeights[2] = 9.80909e-45;
  firsts[0] = 0xd;
  stack0xffffffffffffff8c = 0x41a0000041a00000;
  firstWeights[0] = 1.0;
  instanceWeights[2] = 1.4013e-45;
  instanceWeights[3] = 2.8026e-45;
  instanceCounts[0] = 0x10;
  instanceCounts[1] = 0x11;
  indexMins[2] = 0x41a00000;
  indexMins[3] = 0x41200000;
  instanceWeights[0] = 5.0;
  instanceWeights[1] = 1.0;
  indexMaxs[2] = 0;
  indexMaxs[3] = 1;
  indexMins[0] = 3;
  indexMins[1] = 8;
  indexWeights[2] = 5.60519e-45;
  indexWeights[3] = 1.12104e-44;
  indexMaxs[0] = 0x80;
  indexMaxs[1] = 0x101;
  offsets[2] = 0x42480000;
  offsets[3] = 0x42480000;
  indexWeights[0] = 50.0;
  indexWeights[1] = 50.0;
  offsetWeights[2] = 0.0;
  offsetWeights[3] = 1.4013e-45;
  offsets[0] = 5;
  offsets[1] = 0xc;
  strides[2] = 0x42480000;
  strides[3] = 0x41200000;
  offsetWeights[0] = 10.0;
  offsetWeights[1] = 10.0;
  strideWeights[2] = 0.0;
  strideWeights[3] = 9.80909e-45;
  strides[0] = 0x10;
  strides[1] = 0x11;
  instanceDivisors[2] = 0x42480000;
  instanceDivisors[3] = 0x41200000;
  strideWeights[0] = 10.0;
  strideWeights[1] = 10.0;
  instanceDivisorWeights[2] = 0.0;
  instanceDivisorWeights[3] = 1.4013e-45;
  instanceDivisors[0] = 3;
  instanceDivisors[1] = 0x81;
  indirectOffsets[1] = 0x428c0000;
  indirectOffsets[2] = 0x41f00000;
  instanceDivisorWeights[0] = 10.0;
  instanceDivisorWeights[1] = 10.0;
  indirectOffsetWeigths[1] = 0.0;
  indirectOffsetWeigths[2] = 1.4013e-45;
  indirectOffsets[0] = 2;
  stack0xfffffffffffffec0 = 0x3f80000040000000;
  indirectOffsetWeigths[0] = 1.0;
  local_158[0] = 0;
  local_158[1] = 1;
  baseVertices[0] = -2;
  baseVertices[1] = 4;
  baseVertices[2] = 3;
  stack0xfffffffffffffe88 = 0x3f80000040800000;
  primitiveWeights.weights[5] = 0.0;
  primitiveWeights.weights[6] = 1.4013e-45;
  primitives[0] = PRIMITIVE_TRIANGLE_FAN;
  primitives[1] = PRIMITIVE_TRIANGLE_STRIP;
  primitives[2] = PRIMITIVE_LINES;
  primitives[3] = PRIMITIVE_LINE_STRIP;
  primitives[4] = PRIMITIVE_LINE_LOOP;
  unique0x10000e9d = this;
  UniformWeightArray<7>::UniformWeightArray((UniformWeightArray<7> *)drawMethods);
  drawMethodWeights.weights[0] = 2.8026e-45;
  drawMethodWeights.weights[1] = 8.40779e-45;
  UniformWeightArray<2>::UniformWeightArray((UniformWeightArray<2> *)(indexTypes + 1));
  indexTypeWeights.weights[1] = 0.0;
  indexTypeWeights.weights[2] = 1.4013e-45;
  indexTypes[0] = INDEXTYPE_INT;
  UniformWeightArray<3>::UniformWeightArray((UniformWeightArray<3> *)(inputTypes + 9));
  memcpy(inputTypeWeights.weights + 9,&DAT_02beb590,0x2c);
  UniformWeightArray<11>::UniformWeightArray((UniformWeightArray<11> *)(outputTypes + 0xb));
  memcpy(outputTypeWeights.weights + 10,&DAT_02beb5c0,0x30);
  UniformWeightArray<12>::UniformWeightArray((UniformWeightArray<12> *)local_298);
  memcpy(usageWeights.weights + 7,&DAT_02beb5f0,0x24);
  UniformWeightArray<9>::UniformWeightArray
            ((UniformWeightArray<9> *)
             ((long)&insertedHashes._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &insertedCount);
  stack0xfffffffffffffcd8 = 0;
  for (random.m_rnd.z = 0; (int)random.m_rnd.z < 100; random.m_rnd.z = random.m_rnd.z + 1) {
    de::Random::Random((Random *)local_33c,random.m_rnd.z + 0xc551393);
    iVar3 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)local_33c,(int *)(attribWeights + 1),attribCounts + 1,
                       (float *)(primitiveCounts + 1));
    deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)local_3a8);
    local_3a8._0_4_ = glu::ApiType::es(3,1);
    local_3a8._4_4_ =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive*,float_const*>
                   ((Random *)local_33c,(Primitive *)(primitiveWeights.weights + 5),primitives + 5,
                    (float *)drawMethods);
    spec.apiType.m_bits =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)local_33c,(int *)(primitiveCountWeights + 1),primitiveCounts + 1,
                    (float *)(indexOffsets + 1));
    spec.primitive =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod*,float_const*>
                   ((Random *)local_33c,(DrawMethod *)&drawMethodWeights,drawMethods,
                    (float *)(indexTypes + 1));
    if (spec.primitive == DRAWMETHOD_DRAWARRAYS_INDIRECT) {
      spec.attribs.
      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x10;
LAB_0201f1d8:
      spec.primitiveCount =
           de::Random::
           chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType*,float_const*>
                     ((Random *)local_33c,(IndexType *)(indexTypeWeights.weights + 1),indexTypes + 1
                      ,(float *)(inputTypes + 9));
      spec.drawMethod =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)local_33c,(int *)(indexOffsetWeights + 1),indexOffsets + 1,
                      (float *)(firsts + 1));
      spec.indexType = INDEXTYPE_SHORT;
      spec.indexPointerOffset =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)local_33c,(int *)(firstWeights + 1),firsts + 1,
                      (float *)(instanceCounts + 3));
      spec.indexStorage =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)local_33c,indexMaxs + 2,indexMins + 2,(float *)(offsets + 2));
      spec.first = de::Random::chooseWeighted<int,int_const*,float_const*>
                             ((Random *)local_33c,(int *)(indexWeights + 2),indexMaxs + 2,
                              (float *)(offsets + 2));
      spec.indexMin =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)local_33c,(int *)(instanceWeights + 2),instanceCounts + 2,
                      (float *)(indexMins + 2));
      iVar4 = de::Random::chooseWeighted<int,int_const*,float_const*>
                        ((Random *)local_33c,(int *)(indirectOffsetWeigths + 1),indirectOffsets + 1,
                         (float *)(baseVertices + 4));
      spec.indexMax =
           iVar4 * spec.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      spec.instanceCount =
           de::Random::chooseWeighted<int,int_const*,float_const*>
                     ((Random *)local_33c,local_158,baseVertices + 3,(float *)(primitives + 6));
      bVar2 = deqp::gls::DrawTestSpec::valid((DrawTestSpec *)local_3a8);
      if (bVar2) {
        attribSpec.useDefaultAttribute = false;
        attribSpec.additionalPositionAttribute = false;
        attribSpec.bgraComponentOrder = false;
        attribSpec._39_1_ = 0;
        while ((int)attribSpec._36_4_ < iVar3) {
          deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec((AttributeSpec *)&hash);
          hash = de::Random::
                 chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType*,float_const*>
                           ((Random *)local_33c,(InputType *)(inputTypeWeights.weights + 9),
                            inputTypes + 9,(float *)(outputTypes + 0xb));
          local_3dc = de::Random::
                      chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType*,float_const*>
                                ((Random *)local_33c,(OutputType *)(outputTypeWeights.weights + 10),
                                 outputTypes + 10,(float *)local_298);
          attribSpec.inputType = INPUTTYPE_FIXED;
          attribSpec.outputType =
               de::Random::
               chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage*,float_const*>
                         ((Random *)local_33c,(Usage *)(usageWeights.weights + 7),usages + 7,
                          (float *)((long)&insertedHashes._M_t._M_impl.super__Rb_tree_header.
                                           _M_node_count + 4));
          attribSpec.storage = de::Random::getInt((Random *)local_33c,1,4);
          attribSpec.usage =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)local_33c,(int *)(offsetWeights + 2),offsets + 2,
                          (float *)(strides + 2));
          attribSpec.componentCount =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)local_33c,(int *)(strideWeights + 2),strides + 2,
                          (float *)(instanceDivisors + 2));
          attribSpec.offset._0_1_ = de::Random::getBool((Random *)local_33c);
          attribSpec.stride =
               de::Random::chooseWeighted<int,int_const*,float_const*>
                         ((Random *)local_33c,(int *)(instanceDivisorWeights + 2),
                          instanceDivisors + 2,(float *)(indirectOffsets + 1));
          attribSpec.normalize = de::Random::getBool((Random *)local_33c);
          attrNdx_1 = local_3a8._0_4_;
          attribSpec.instanceDivisor._3_1_ =
               deqp::gls::DrawTestSpec::AttributeSpec::valid
                         ((AttributeSpec *)&hash,(ApiType)local_3a8._0_4_);
          SVar1 = attribSpec.storage;
          if ((attribSpec.componentCount != 0) &&
             (iVar4 = deqp::gls::DrawTestSpec::inputTypeSize(hash),
             attribSpec.componentCount < (int)(SVar1 * iVar4))) {
            attribSpec.instanceDivisor._3_1_ = 0;
          }
          if ((attribSpec.instanceDivisor._3_1_ & 1) != 0) {
            std::
            vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ::push_back((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         *)&spec.baseVertex,(value_type *)&hash);
            attribSpec._36_4_ = attribSpec._36_4_ + 1;
          }
        }
        if (local_3a8._4_4_ != PRIMITIVE_POINTS) {
          pvVar7 = std::
                   vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                 *)&spec.baseVertex,0);
          pvVar7->instanceDivisor = 0;
        }
        if (((spec.primitive == PRIMITIVE_LINES) && (spec.indexStorage == spec.first)) &&
           (local_3a8._4_4_ != PRIMITIVE_POINTS)) {
          iStack_3b0 = 4;
        }
        else {
          pvVar7 = std::
                   vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                 *)&spec.baseVertex,0);
          if (((pvVar7->useDefaultAttribute & 1U) == 0) || (local_3a8._4_4_ == PRIMITIVE_POINTS)) {
            if ((local_3a8._4_4_ == PRIMITIVE_TRIANGLES) ||
               ((local_3a8._4_4_ == PRIMITIVE_TRIANGLE_FAN ||
                (local_3a8._4_4_ == PRIMITIVE_TRIANGLE_STRIP)))) {
              pvVar7 = std::
                       vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                       ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                     *)&spec.baseVertex,0);
              if (pvVar7->componentCount == 1) {
                iStack_3b0 = 4;
              }
              else {
                pvVar7 = std::
                         vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                       *)&spec.baseVertex,0);
                if (((pvVar7->outputType == OUTPUTTYPE_FLOAT) ||
                    (pvVar7 = std::
                              vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                              ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                            *)&spec.baseVertex,0),
                    pvVar7->outputType == OUTPUTTYPE_INT)) ||
                   (pvVar7 = std::
                             vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                             ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                           *)&spec.baseVertex,0),
                   pvVar7->outputType == OUTPUTTYPE_UINT)) {
                  iStack_3b0 = 4;
                }
                else {
                  if ((spec.primitive != PRIMITIVE_LINES) ||
                     (1 < (int)(spec.first - spec.indexStorage))) goto LAB_0201f78b;
                  iStack_3b0 = 4;
                }
              }
            }
            else {
LAB_0201f78b:
              local_3e8 = deqp::gls::DrawTestSpec::hash((DrawTestSpec *)local_3a8);
              for (local_3ec = 0; local_3ec < iVar3; local_3ec = local_3ec + 1) {
                uVar5 = local_3e8 << 2;
                pvVar7 = std::
                         vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                         ::operator[]((vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                       *)&spec.baseVertex,(long)local_3ec);
                local_3e8 = deqp::gls::DrawTestSpec::AttributeSpec::hash(pvVar7);
                local_3e8 = uVar5 ^ local_3e8;
              }
              local_3f8._M_node =
                   (_Base_ptr)
                   std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   find((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *
                        )&insertedCount,&local_3e8);
              local_400._M_node =
                   (_Base_ptr)
                   std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                   end((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &insertedCount);
              bVar2 = std::operator==(&local_3f8,&local_400);
              if (bVar2) {
                CVar6 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_3a8);
                if ((CVar6 != COMPATIBILITY_UNALIGNED_OFFSET) &&
                   (CVar6 = deqp::gls::DrawTestSpec::isCompatibilityTest((DrawTestSpec *)local_3a8),
                   CVar6 != COMPATIBILITY_UNALIGNED_STRIDE)) {
                  this_00 = (DrawTest *)operator_new(0x138);
                  testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx
                  ;
                  renderCtx = gles31::Context::getRenderContext
                                        ((this->super_TestCaseGroup).m_context);
                  de::toString<unsigned_long>(&local_420,(unsigned_long *)&random.m_rnd.w);
                  name = (char *)std::__cxx11::string::c_str();
                  deqp::gls::DrawTestSpec::getDesc_abi_cxx11_(&local_440,(DrawTestSpec *)local_3a8);
                  desc = (char *)std::__cxx11::string::c_str();
                  deqp::gls::DrawTest::DrawTest
                            (this_00,testCtx,renderCtx,(DrawTestSpec *)local_3a8,name,desc);
                  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
                  std::__cxx11::string::~string((string *)&local_440);
                  std::__cxx11::string::~string((string *)&local_420);
                }
                std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &insertedCount,&local_3e8);
                register0x00000000 = stack0xfffffffffffffcd8 + 1;
              }
              iStack_3b0 = 0;
            }
          }
          else {
            iStack_3b0 = 4;
          }
        }
      }
      else {
        iStack_3b0 = 4;
      }
    }
    else {
      if (spec.primitive == DRAWMETHOD_DRAWELEMENTS_INDIRECT) {
        spec.attribs.
        super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x14;
        goto LAB_0201f1d8;
      }
      iStack_3b0 = 1;
    }
    deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)local_3a8);
    de::Random::~Random((Random *)local_33c);
    if ((iStack_3b0 != 0) && (iStack_3b0 != 4)) break;
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &insertedCount);
  return extraout_EAX;
}

Assistant:

void RandomGroup::init (void)
{
	const int	numAttempts				= 100;

	const int	attribCounts[]			= { 1,   2,   5 };
	const float	attribWeights[]			= { 30, 10,   1 };
	const int	primitiveCounts[]		= { 1,   5,  64 };
	const float	primitiveCountWeights[]	= { 20, 10,   1 };
	const int	indexOffsets[]			= { 0,   7,  13 };
	const float	indexOffsetWeights[]	= { 20, 20,   1 };
	const int	firsts[]				= { 0,   7,  13 };
	const float	firstWeights[]			= { 20, 20,   1 };

	const int	instanceCounts[]		= { 1,   2,  16,  17 };
	const float	instanceWeights[]		= { 20, 10,   5,   1 };
	const int	indexMins[]				= { 0,   1,   3,   8 };
	const int	indexMaxs[]				= { 4,   8, 128, 257 };
	const float	indexWeights[]			= { 50, 50,  50,  50 };
	const int	offsets[]				= { 0,   1,   5,  12 };
	const float	offsetWeights[]			= { 50, 10,  10,  10 };
	const int	strides[]				= { 0,   7,  16,  17 };
	const float	strideWeights[]			= { 50, 10,  10,  10 };
	const int	instanceDivisors[]		= { 0,   1,   3, 129 };
	const float	instanceDivisorWeights[]= { 70, 30,  10,  10 };

	const int	indirectOffsets[]		= { 0,   1,   2 };
	const float indirectOffsetWeigths[]	= { 2,   1,   1 };
	const int	baseVertices[]			= { 0,   1,  -2,   4,  3 };
	const float baseVertexWeigths[]		= { 4,   1,   1,   1,  1 };

	gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		int					drawCommandSize;
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,1);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);

		if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INDIRECT)
			drawCommandSize = sizeof(deUint32[4]);
		else if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INDIRECT)
			drawCommandSize = sizeof(deUint32[5]);
		else
		{
			DE_ASSERT(DE_FALSE);
			return;
		}

		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= gls::DrawTestSpec::STORAGE_BUFFER;
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);
		spec.indirectOffset			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indirectOffsets),	DE_ARRAY_END(indirectOffsets),	indirectOffsetWeigths) * drawCommandSize;
		spec.baseVertex				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(baseVertices),		DE_ARRAY_END(baseVertices),		baseVertexWeigths);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= gls::DrawTestSpec::STORAGE_BUFFER;
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only aligned cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET &&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE)
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}